

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O2

pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> * __thiscall
lattice::supercell::add_offset
          (pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          supercell *this,size_t index,offset_t *offset)

{
  pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *ppVar1;
  size_t sVar2;
  size_t m;
  ulong index_00;
  bool bVar3;
  CoeffReturnType CVar4;
  long lStack_c0;
  offset_t cell;
  offset_t crossing;
  supercell *local_90;
  offset_t *local_88;
  undefined8 local_80;
  span_t *local_78;
  undefined8 local_70;
  ulong local_68;
  offset_t *local_60;
  pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *local_58;
  MatrixXd *local_50;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>
  p;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&this->index2lcord_,index);
  lcord2offset((supercell *)&p,(size_t)this);
  local_90 = (supercell *)&p;
  local_88 = offset;
  Eigen::PlainObjectBase<Eigen::Matrix<long,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<long,long>,Eigen::Matrix<long,_1,1,0,_1,1>const,Eigen::Matrix<long,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<long,_1,1,0,_1,1>> *)&cell,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<long,_long>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
              *)&local_90);
  local_58 = __return_storage_ptr__;
  free(p.m_lhs);
  local_90 = (supercell *)this->dim_;
  local_80 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<long,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,Eigen::Matrix<long,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<long,_1,1,0,_1,1>> *)&crossing,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
              *)&local_90);
  local_50 = &this->rs_;
  do {
    p.m_lhs = local_50;
    p.m_rhs.m_xpr = &cell;
    bVar3 = true;
    for (index_00 = 0; index_00 < this->dim_; index_00 = index_00 + 1) {
      CVar4 = Eigen::
              DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_0>
              ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_0>
                       *)&p,index_00);
      if (-1e-08 <= CVar4) {
        CVar4 = Eigen::
                DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_0>
                ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_0>
                         *)&p,index_00);
        if (0.99999999 < CVar4) {
          local_88 = (offset_t *)
                     (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
          local_90 = (supercell *)
                     ((this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data + (long)local_88 * index_00);
          local_70 = 0;
          local_78 = &this->span_;
          local_68 = index_00;
          local_60 = local_88;
          Eigen::MatrixBase<Eigen::Matrix<long,-1,1,0,-1,1>>::operator-=
                    ((MatrixBase<Eigen::Matrix<long,_1,1,0,_1,1>> *)&cell,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<long,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)&local_90);
          lStack_c0 = 1;
          goto LAB_0010b3a3;
        }
      }
      else {
        local_88 = (offset_t *)
                   (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
        local_90 = (supercell *)
                   ((this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + (long)local_88 * index_00);
        local_70 = 0;
        local_78 = &this->span_;
        local_68 = index_00;
        local_60 = local_88;
        Eigen::MatrixBase<Eigen::Matrix<long,-1,1,0,-1,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<long,_1,1,0,_1,1>> *)&cell,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<long,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)&local_90);
        lStack_c0 = -1;
LAB_0010b3a3:
        crossing.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [index_00] = crossing.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage
                     .m_data[index_00] + lStack_c0;
        bVar3 = false;
      }
    }
    if (bVar3) {
      sVar2 = offset2lcord(this,&cell);
      ppVar1 = local_58;
      sVar2 = lcord2index(this,sVar2);
      ppVar1->first = sVar2;
      Eigen::DenseStorage<long,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<long,__1,__1,_1,_0> *)&ppVar1->second,
                 (DenseStorage<long,__1,__1,_1,_0> *)&crossing);
      free(crossing.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(cell.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      return ppVar1;
    }
  } while( true );
}

Assistant:

std::pair<std::size_t, offset_t> add_offset(std::size_t index, const offset_t& offset) const {
    offset_t cell = lcord2offset(index2lcord_.at(index)) + offset;
    offset_t crossing = offset_t::Zero(dim_);
    const double eps = 1.0e-8;
    bool checked = false;
    while (!checked) {
      checked = true;
      auto p = rs_ * cell.cast<double>();
      for (std::size_t m = 0; m < dim_; ++m) {
        if (p(m) < -eps) {
          checked = false;
          cell += span_.col(m);
          crossing(m) -= 1;
        } else if (p(m) > (1.0 - eps)) {
          checked = false;
          cell -= span_.col(m);
          crossing(m) += 1;
        }
      }
    }
    return std::make_pair(lcord2index(offset2lcord(cell)), crossing);
  }